

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeTypeFunction(ExpressionContext *ctx,SynTypeFunction *syntax)

{
  TypeBase *pTVar1;
  int iVar2;
  TypeBase *pTVar3;
  undefined4 extraout_var;
  SynBase *this;
  SynCallArgument *node;
  SynFunctionCall *syntax_00;
  ExprBase *pEVar4;
  SynBase *pSVar5;
  IntrusiveList<SynCallArgument> arguments;
  IntrusiveList<SynCallArgument> local_58;
  SynCallArgument *local_48;
  SynCallArgument *pSStack_40;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pTVar3 = AnalyzeType(ctx,&syntax->super_SynBase,false,(bool *)0x0);
  if (pTVar3 == (TypeBase *)0x0) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (SynBase *)CONCAT44(extraout_var_00,iVar2);
    pSVar5 = syntax->returnType;
    SynBase::SynBase(this,10,(syntax->super_SynBase).begin,(syntax->super_SynBase).end);
    this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6b08;
    this[1]._vptr_SynBase = (_func_int **)pSVar5;
    local_58.head = (SynCallArgument *)0x0;
    local_58.tail = (SynCallArgument *)0x0;
    pSVar5 = (syntax->arguments).head;
    if (pSVar5 != (SynBase *)0x0) {
      do {
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        node = (SynCallArgument *)CONCAT44(extraout_var_01,iVar2);
        SynBase::SynBase((SynBase *)node,0x18,pSVar5->begin,pSVar5->end);
        (node->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6a28;
        node->name = (SynIdentifier *)0x0;
        node->value = pSVar5;
        IntrusiveList<SynCallArgument>::push_back(&local_58,node);
        pSVar5 = pSVar5->next;
      } while (pSVar5 != (SynBase *)0x0);
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    syntax_00 = (SynFunctionCall *)CONCAT44(extraout_var_02,iVar2);
    local_48 = local_58.head;
    pSStack_40 = local_58.tail;
    SynBase::SynBase((SynBase *)syntax_00,0x1a,(syntax->super_SynBase).begin,
                     (syntax->super_SynBase).end);
    (syntax_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f7160;
    syntax_00->value = this;
    (syntax_00->aliases).head = (SynBase *)0x0;
    (syntax_00->aliases).tail = (SynBase *)0x0;
    (syntax_00->arguments).head = local_48;
    (syntax_00->arguments).tail = pSStack_40;
    pEVar4 = AnalyzeFunctionCall(ctx,syntax_00);
  }
  else {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar4 = (ExprBase *)CONCAT44(extraout_var,iVar2);
    pTVar1 = ctx->typeTypeID;
    pEVar4->typeID = 8;
    pEVar4->source = &syntax->super_SynBase;
    pEVar4->type = pTVar1;
    pEVar4->next = (ExprBase *)0x0;
    pEVar4->listed = false;
    pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6558;
    pEVar4[1]._vptr_ExprBase = (_func_int **)pTVar3;
  }
  return pEVar4;
}

Assistant:

ExprBase* AnalyzeTypeFunction(ExpressionContext &ctx, SynTypeFunction *syntax)
{
	if(TypeBase *type = AnalyzeType(ctx, syntax, false))
		return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(syntax, ctx.typeTypeID, type);

	// Transform 'type ref(arguments)' into a 'type ref' constructor call
	SynBase* value = new (ctx.get<SynTypeReference>()) SynTypeReference(syntax->begin, syntax->end, syntax->returnType);

	IntrusiveList<SynCallArgument> arguments;

	for(SynBase *curr = syntax->arguments.head; curr; curr = curr->next)
		arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(curr->begin, curr->end, NULL, curr));

	return AnalyzeFunctionCall(ctx, new (ctx.get<SynFunctionCall>()) SynFunctionCall(syntax->begin, syntax->end, value, IntrusiveList<SynBase>(), arguments));
}